

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpnghandler.cpp
# Opt level: O1

void iod_read_fn(png_structp png_ptr,png_bytep data,png_size_t length)

{
  float fVar1;
  float fVar2;
  png_struct *ppVar3;
  png_info *ppVar4;
  QString *pQVar5;
  Representation RVar6;
  Representation RVar7;
  char cVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  Format FVar13;
  long lVar14;
  QIODevice *pQVar15;
  long lVar16;
  __jmp_buf_tag *__env;
  ulong uVar17;
  uchar *puVar18;
  qsizetype qVar19;
  png_byte **pppVar20;
  uchar *puVar21;
  QRgb c;
  ulong uVar22;
  byte *pbVar23;
  char *image;
  byte *pbVar24;
  QPngHandlerPrivate *this;
  QSize size;
  QSize size_00;
  int iVar25;
  QSize size_01;
  QSize size_02;
  QSize size_03;
  QSize size_04;
  QSize size_05;
  long in_FS_OFFSET;
  undefined1 auVar26 [16];
  int iStack_94;
  ulong uStack_90;
  int iStack_84;
  ulong uStack_80;
  QPoint QStack_78;
  uint uStack_70;
  int iStack_6c;
  Representation RStack_68;
  Representation RStack_64;
  long lStack_60;
  png_structp ppStack_58;
  QIODevice *pQStack_50;
  long lStack_48;
  png_bytep ppStack_40;
  png_size_t pStack_38;
  
  lVar14 = png_get_io_ptr();
  pQVar15 = QImageIOHandler::device(*(QImageIOHandler **)(lVar14 + 0x78));
  if (((*(int *)(lVar14 + 0x70) == 2) &&
      (cVar8 = (**(code **)(*(long *)pQVar15 + 0x60))(pQVar15), cVar8 == '\0')) &&
     (lVar16 = (**(code **)(*(long *)pQVar15 + 0x80))(pQVar15), 0 < lVar16)) {
    lVar14 = (**(code **)(*(long *)pQVar15 + 0x80))(pQVar15);
    lVar16 = (**(code **)(*(long *)pQVar15 + 0x78))(pQVar15);
    if ((length == 4) && (lVar14 = lVar14 - lVar16, lVar14 < 4)) {
      data[0] = 0xae;
      data[1] = 'B';
      data[2] = '`';
      data[3] = 0x82;
      auVar26 = (**(code **)(*(long *)pQVar15 + 0x80))(pQVar15);
      (**(code **)(*(long *)pQVar15 + 0x88))
                (pQVar15,auVar26._0_8_,auVar26._8_8_,*(code **)(*(long *)pQVar15 + 0x88));
      return;
    }
  }
  if (length != 0) {
    do {
      uVar10 = QIODevice::read((char *)pQVar15,(longlong)data);
      if ((int)uVar10 < 1) {
        image = "Read Error";
        this = (QPngHandlerPrivate *)png_ptr;
        png_error();
        lStack_60 = *(long *)(in_FS_OFFSET + 0x28);
        ppStack_58 = png_ptr;
        pQStack_50 = pQVar15;
        lStack_48 = lVar14;
        ppStack_40 = data;
        pStack_38 = length;
        if (this->state == Error) goto LAB_005b173b;
        if ((this->state == Ready) && (bVar9 = QPngHandlerPrivate::readPngHeader(this), !bVar9))
        goto LAB_005b1732;
        this->row_pointers = (png_byte **)0x0;
        __env = (__jmp_buf_tag *)png_set_longjmp_fn(this->png_ptr,__longjmp_chk,200);
        iVar11 = _setjmp(__env);
        if (iVar11 != 0) goto LAB_005b1717;
        fVar1 = this->gamma;
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
          fVar2 = this->fileGamma;
          if ((fVar2 != 0.0) || (NAN(fVar2))) {
            png_set_gamma(SUB84((double)(1.0 / fVar1),0),(double)fVar2,this->png_ptr);
            QColorSpace::setTransferFunction(&this->colorSpace,Gamma,1.0 / this->gamma);
            this->colorSpaceState = GammaChrm;
          }
        }
        ppVar3 = this->png_ptr;
        ppVar4 = this->info_ptr;
        RStack_64.m_i = 0;
        RStack_68.m_i = 0;
        iStack_6c = 0;
        uStack_70 = 0;
        QStack_78.xp.m_i = 0;
        QStack_78.yp.m_i = 0;
        uStack_80 = 0;
        iStack_84 = -0x55555556;
        uStack_90 = 0;
        iStack_94 = -0x55555556;
        png_get_IHDR(ppVar3,ppVar4,&RStack_64,&RStack_68,&iStack_6c,&uStack_70,0,0,0);
        RVar7.m_i = RStack_64.m_i;
        RVar6.m_i = RStack_68.m_i;
        png_set_interlace_handling(ppVar3);
        if (uStack_70 == 3) {
          iVar11 = png_get_PLTE(ppVar3,ppVar4,&uStack_90,&iStack_94);
          if ((iVar11 != 0) && (iStack_94 < 0x101)) {
            if (iStack_6c != 1) {
              png_set_packing(ppVar3);
            }
            png_read_update_info(ppVar3,ppVar4);
            png_get_IHDR(ppVar3,ppVar4,&RStack_64,&RStack_68,&iStack_6c,&uStack_70,0,0,0);
            iVar11 = iStack_6c;
            size.ht.m_i = RStack_68.m_i;
            size.wd.m_i = RStack_64.m_i;
            bVar9 = QImageIOHandler::allocateImage
                              (size,(uint)(iStack_6c != 1) * 2 + Format_Mono,(QImage *)image);
            if (!bVar9) goto LAB_005b1717;
            png_get_PLTE(ppVar3,ppVar4,&uStack_90,&iStack_94);
            iVar12 = 2;
            if (iVar11 != 1) {
              iVar12 = iStack_94;
            }
            QImage::setColorCount((QImage *)image,iVar12);
            iVar11 = png_get_tRNS(ppVar3,ppVar4,&QStack_78,&iStack_84,&uStack_80);
            uVar17 = 0;
            if ((iVar11 == 0) || (QStack_78 == (QPoint)0x0)) {
              uVar17 = 0;
            }
            else if (0 < iStack_84) {
              lVar14 = 2;
              uVar17 = 0;
              do {
                QImage::setColor((QImage *)image,(int)uVar17,
                                 (uint)*(byte *)((uStack_90 - 1) + lVar14) << 8 |
                                 (uint)*(byte *)((uStack_90 - 2) + lVar14) << 0x10 |
                                 (uint)*(byte *)(uStack_90 + lVar14) |
                                 (uint)*(byte *)((long)QStack_78 + uVar17) << 0x18);
                uVar17 = uVar17 + 1;
                lVar14 = lVar14 + 3;
              } while ((long)uVar17 < (long)iStack_84);
            }
            if ((int)uVar17 < iStack_94) {
              lVar14 = (uVar17 & 0xffffffff) * 3 + 2;
              uVar17 = uVar17 & 0xffffffff;
              do {
                QImage::setColor((QImage *)image,(int)uVar17,
                                 (uint)*(byte *)((uStack_90 - 1) + lVar14) << 8 |
                                 (uint)*(byte *)((uStack_90 - 2) + lVar14) << 0x10 |
                                 (uint)*(byte *)(uStack_90 + lVar14) | 0xff000000);
                uVar10 = (int)uVar17 + 1;
                lVar14 = lVar14 + 3;
                uVar17 = (ulong)uVar10;
              } while ((int)uVar10 < iStack_94);
            }
            png_set_bgr(ppVar3);
joined_r0x005b1707:
            if (bVar9) {
LAB_005b1773:
              uStack_80 = uStack_80 & 0xffffffff00000000;
              uStack_90 = uStack_90 & 0xffffffff00000000;
              RStack_64.m_i = 0;
              RStack_68.m_i = 0;
              iStack_6c = 0;
              uStack_70 = 0;
              iStack_84 = 0;
              png_get_IHDR(this->png_ptr,this->info_ptr,&uStack_80,&uStack_90,&iStack_6c,&uStack_70,
                           0,0,0);
              png_get_oFFs(this->png_ptr,this->info_ptr,&RStack_64,&RStack_68,&iStack_84);
              puVar18 = QImage::bits((QImage *)image);
              qVar19 = QImage::bytesPerLine((QImage *)image);
              uVar17 = uStack_90 & 0xffffffff;
              pppVar20 = (png_byte **)operator_new__(uVar17 * 8);
              this->row_pointers = pppVar20;
              if (uVar17 != 0) {
                uVar22 = 0;
                puVar21 = puVar18;
                do {
                  this->row_pointers[uVar22] = puVar21;
                  uVar22 = uVar22 + 1;
                  puVar21 = puVar21 + qVar19;
                } while (uVar17 != uVar22);
              }
              png_read_image(this->png_ptr,this->row_pointers);
              iVar11 = png_get_x_pixels_per_meter(this->png_ptr,this->info_ptr);
              QImage::setDotsPerMeterX((QImage *)image,iVar11);
              iVar11 = png_get_y_pixels_per_meter(this->png_ptr,this->info_ptr);
              QImage::setDotsPerMeterY((QImage *)image,iVar11);
              if (iStack_84 == 0) {
                QStack_78.yp.m_i = RStack_68.m_i;
                QStack_78.xp.m_i = RStack_64.m_i;
                QImage::setOffset((QImage *)image,&QStack_78);
              }
              if ((uStack_70 == 3) &&
                 (FVar13 = QImage::format((QImage *)image), FVar13 == Format_Indexed8)) {
                iVar11 = QImage::colorCount((QImage *)image);
                if (0 < (int)uStack_90) {
                  lVar14 = 0;
                  do {
                    if ((uStack_80 & 0xffffffff) != 0) {
                      pbVar24 = puVar18 + qVar19 * lVar14;
                      pbVar23 = pbVar24 + (uStack_80 & 0xffffffff);
                      do {
                        if (iVar11 <= (int)(uint)*pbVar24) {
                          *pbVar24 = 0;
                        }
                        pbVar24 = pbVar24 + 1;
                      } while (pbVar24 < pbVar23);
                    }
                    lVar14 = lVar14 + 1;
                  } while (lVar14 < (int)uStack_90);
                }
              }
              this->state = ReadingEnd;
              png_read_end(this->png_ptr,this->end_info);
              QPngHandlerPrivate::readPngTexts(this,this->end_info);
              if (1 < (ulong)(this->readTexts).d.size) {
                lVar16 = 0;
                lVar14 = lVar16;
                do {
                  pQVar5 = (this->readTexts).d.ptr;
                  QImage::setText((QImage *)image,(QString *)((long)&(pQVar5->d).d + lVar16),
                                  (QString *)((long)&pQVar5[1].d.d + lVar16));
                  lVar14 = lVar14 + 2;
                  lVar16 = lVar16 + 0x30;
                } while (lVar14 < (this->readTexts).d.size + -1);
              }
              png_destroy_read_struct(&this->png_ptr,&this->info_ptr,&this->end_info);
              this->png_ptr = (png_struct *)0x0;
              if (this->row_pointers != (png_byte **)0x0) {
                operator_delete__(this->row_pointers);
              }
              this->row_pointers = (png_byte **)0x0;
              this->state = Ready;
              if (0 < (int)this->colorSpaceState) {
                bVar9 = QColorSpace::isValid(&this->colorSpace);
                if (bVar9) {
                  QImage::setColorSpace((QImage *)image,&this->colorSpace);
                }
              }
            }
            else {
LAB_005b1717:
              png_destroy_read_struct(&this->png_ptr,&this->info_ptr,&this->end_info);
              this->png_ptr = (png_struct *)0x0;
              if (this->row_pointers != (png_byte **)0x0) {
                operator_delete__(this->row_pointers);
              }
LAB_005b1732:
              this->state = Error;
            }
LAB_005b173b:
            if (*(long *)(in_FS_OFFSET + 0x28) != lStack_60) {
              __stack_chk_fail();
            }
            return;
          }
LAB_005b1318:
          if (iStack_6c == 0x10) {
            if ((uStack_70 & 1) == 0) {
              FVar13 = Format_RGBA64;
              if (((uStack_70 & 4) == 0) &&
                 (iVar11 = png_get_valid(ppVar3,ppVar4,0x10), iVar11 == 0)) {
                png_set_filler(ppVar3,0xffff,1);
                FVar13 = Format_RGBX64;
              }
              if ((uStack_70 & 2) == 0) {
                png_set_gray_to_rgb(ppVar3);
              }
LAB_005b138b:
              size_00.ht.m_i = RVar6.m_i;
              size_00.wd.m_i = RVar7.m_i;
              bVar9 = QImageIOHandler::allocateImage(size_00,FVar13,(QImage *)image);
              if (!bVar9) goto LAB_005b1717;
              png_read_update_info(ppVar3,ppVar4);
LAB_005b164d:
              png_set_swap(ppVar3);
              goto LAB_005b1773;
            }
            png_set_strip_16(ppVar3);
          }
          png_set_expand(ppVar3);
          if (uStack_70 == 4) {
            png_set_gray_to_rgb(ppVar3);
          }
          if ((uStack_70 & 4) == 0) {
            iVar11 = png_get_valid(ppVar3,ppVar4,0x10);
            FVar13 = Format_ARGB32;
            if (iVar11 == 0) {
              png_set_filler(ppVar3,0xff,1);
              FVar13 = Format_RGB32;
            }
          }
          else {
            FVar13 = Format_ARGB32;
          }
          size_02.ht.m_i = RVar6.m_i;
          size_02.wd.m_i = RVar7.m_i;
          bVar9 = QImageIOHandler::allocateImage(size_02,FVar13,(QImage *)image);
          if (!bVar9) goto LAB_005b1717;
          png_set_bgr(ppVar3);
        }
        else {
          if (uStack_70 != 0) goto LAB_005b1318;
          if ((iStack_6c == 1) && (cVar8 = png_get_channels(ppVar3,ppVar4), cVar8 == '\x01')) {
            png_set_invert_mono(ppVar3);
            png_read_update_info(ppVar3,ppVar4);
            size_01.ht.m_i = RVar6.m_i;
            size_01.wd.m_i = RVar7.m_i;
            bVar9 = QImageIOHandler::allocateImage(size_01,Format_Mono,(QImage *)image);
            if (!bVar9) goto LAB_005b1717;
            QImage::setColorCount((QImage *)image,2);
            QImage::setColor((QImage *)image,1,0xff000000);
            QImage::setColor((QImage *)image,0,0xffffffff);
            iVar11 = png_get_tRNS(ppVar3,ppVar4,&QStack_78,&iStack_84,&uStack_80);
            if (uStack_80 == 0 || iVar11 == 0) goto LAB_005b1773;
            if (*(short *)(uStack_80 + 8) == 1) {
              iVar11 = 0;
              c = 0xffffff;
            }
            else {
              if (*(short *)(uStack_80 + 8) != 0) goto LAB_005b1773;
              iVar11 = 1;
              c = 0;
            }
            QImage::setColor((QImage *)image,iVar11,c);
            goto LAB_005b1773;
          }
          if (((iStack_6c == 0x10) && (cVar8 = png_get_channels(ppVar3,ppVar4), cVar8 == '\x01')) &&
             (iVar11 = png_get_valid(ppVar3,ppVar4,0x10), iVar11 == 0)) {
            FVar13 = Format_Grayscale16;
            goto LAB_005b138b;
          }
          if (iStack_6c != 8) {
            if (iStack_6c != 0x10) goto LAB_005b14de;
            iVar11 = png_get_valid(ppVar3,ppVar4,0x10);
            if (iVar11 == 0) {
              png_set_filler(ppVar3,0xffff,1);
              FVar13 = Format_RGBX64;
            }
            else {
              png_set_expand();
              FVar13 = Format_RGBA64;
            }
            png_set_gray_to_rgb(ppVar3);
            size_04.ht.m_i = RVar6.m_i;
            size_04.wd.m_i = RVar7.m_i;
            bVar9 = QImageIOHandler::allocateImage(size_04,FVar13,(QImage *)image);
            if (bVar9) {
              png_read_update_info(ppVar3,ppVar4);
              goto LAB_005b164d;
            }
            goto LAB_005b1717;
          }
          iVar11 = png_get_valid(ppVar3,ppVar4,0x10);
          if (iVar11 != 0) {
LAB_005b14de:
            if (iStack_6c < 8) {
              png_set_packing(ppVar3);
            }
            iVar11 = 0x100;
            if (iStack_6c < 8) {
              iVar11 = 1 << ((byte)iStack_6c & 0x1f);
            }
            png_read_update_info(ppVar3,ppVar4);
            size_03.ht.m_i = RVar6.m_i;
            size_03.wd.m_i = RVar7.m_i;
            bVar9 = QImageIOHandler::allocateImage(size_03,Format_Indexed8,(QImage *)image);
            if (bVar9) {
              QImage::setColorCount((QImage *)image,iVar11);
              if (0 < iVar11) {
                iVar25 = 0;
                iVar12 = 0;
                do {
                  uVar10 = iVar25 / (iVar11 + -1);
                  QImage::setColor((QImage *)image,iVar12,
                                   (uVar10 & 0xff) << 8 | uVar10 << 0x10 | uVar10 & 0xff |
                                   0xff000000);
                  iVar12 = iVar12 + 1;
                  iVar25 = iVar25 + 0xff;
                } while (iVar11 != iVar12);
              }
              iVar12 = png_get_tRNS(ppVar3,ppVar4,&QStack_78,&iStack_84,&uStack_80);
              if ((iVar12 != 0 && uStack_80 != 0) &&
                 ((int)(uint)*(ushort *)(uStack_80 + 8) < iVar11)) {
                QImage::setColor((QImage *)image,(uint)*(ushort *)(uStack_80 + 8),0);
              }
              goto joined_r0x005b1707;
            }
            goto LAB_005b1717;
          }
          png_set_expand(ppVar3);
          size_05.ht.m_i = RVar6.m_i;
          size_05.wd.m_i = RVar7.m_i;
          bVar9 = QImageIOHandler::allocateImage(size_05,Format_Grayscale8,(QImage *)image);
          if (!bVar9) goto LAB_005b1717;
        }
        png_read_update_info(ppVar3,ppVar4);
        goto LAB_005b1773;
      }
      length = length - (uVar10 & 0x7fffffff);
    } while (length != 0);
  }
  return;
}

Assistant:

static
void iod_read_fn(png_structp png_ptr, png_bytep data, png_size_t length)
{
    QPngHandlerPrivate *d = (QPngHandlerPrivate *)png_get_io_ptr(png_ptr);
    QIODevice *in = d->q->device();

    if (d->state == QPngHandlerPrivate::ReadingEnd && !in->isSequential() && in->size() > 0 && (in->size() - in->pos()) < 4 && length == 4) {
        // Workaround for certain malformed PNGs that lack the final crc bytes
        uchar endcrc[4] = { 0xae, 0x42, 0x60, 0x82 };
        memcpy(data, endcrc, 4);
        in->seek(in->size());
        return;
    }

    while (length) {
        int nr = in->read((char*)data, length);
        if (nr <= 0) {
            png_error(png_ptr, "Read Error");
            return;
        }
        length -= nr;
    }
}